

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int lua_getinfo(lua_State *L,char *what,lua_Debug *ar)

{
  StkId pTVar1;
  int iVar2;
  char *pcVar3;
  TValue *i_o;
  StkId func;
  CallInfo *ci;
  Closure *f;
  int status;
  lua_Debug *ar_local;
  char *what_local;
  lua_State *L_local;
  
  ci = (CallInfo *)0x0;
  func = (StkId)0x0;
  if (*what == '>') {
    ar_local = (lua_Debug *)(what + 1);
    ci = (CallInfo *)L->top[-1].value.gc;
    L->top = L->top + -1;
  }
  else {
    ar_local = (lua_Debug *)what;
    if (ar->i_ci != 0) {
      func = (StkId)(L->base_ci + ar->i_ci);
      ci = (CallInfo *)(((CallInfo *)func)->func->value).gc;
    }
  }
  iVar2 = auxgetinfo(L,(char *)ar_local,ar,(Closure *)ci,(CallInfo *)func);
  pcVar3 = strchr((char *)ar_local,0x66);
  if (pcVar3 != (char *)0x0) {
    if (ci == (CallInfo *)0x0) {
      L->top->tt = 0;
    }
    else {
      pTVar1 = L->top;
      (pTVar1->value).gc = (GCObject *)ci;
      pTVar1->tt = 6;
    }
    if ((long)L->stack_last - (long)L->top < 0x11) {
      luaD_growstack(L,1);
    }
    L->top = L->top + 1;
  }
  pcVar3 = strchr((char *)ar_local,0x4c);
  if (pcVar3 != (char *)0x0) {
    collectvalidlines(L,(Closure *)ci);
  }
  return iVar2;
}

Assistant:

static int lua_getinfo(lua_State*L,const char*what,lua_Debug*ar){
int status;
Closure*f=NULL;
CallInfo*ci=NULL;
if(*what=='>'){
StkId func=L->top-1;
luai_apicheck(L,ttisfunction(func));
what++;
f=clvalue(func);
L->top--;
}
else if(ar->i_ci!=0){
ci=L->base_ci+ar->i_ci;
f=clvalue(ci->func);
}
status=auxgetinfo(L,what,ar,f,ci);
if(strchr(what,'f')){
if(f==NULL)setnilvalue(L->top);
else setclvalue(L,L->top,f);
incr_top(L);
}
if(strchr(what,'L'))
collectvalidlines(L,f);
return status;
}